

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_misc.c
# Opt level: O2

err_t bignKeypairVal(bign_params *params,octet *privkey,octet *pubkey)

{
  size_t count;
  size_t count_00;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec;
  u64 *dest;
  u64 *dest_00;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(params);
    if (bVar1 == 0) {
      eVar2 = 0x1f6;
    }
    else {
      sVar4 = bignStart_keep(params->l,bignKeypairVal_deep);
      ec = (ec_o *)blobCreate(sVar4);
      if (ec == (ec_o *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        eVar2 = bignStart(ec,params);
        if (eVar2 == 0) {
          sVar4 = ec->f->n;
          count_00 = ec->f->no;
          bVar1 = memIsValid(privkey,count_00);
          eVar2 = 0x6d;
          if (bVar1 != 0) {
            count = count_00 * 2;
            bVar1 = memIsValid(pubkey,count);
            if (bVar1 != 0) {
              dest_00 = (u64 *)((long)&(ec->hdr).keep + (ec->hdr).keep);
              dest = dest_00 + sVar4;
              u64From(dest_00,privkey,count_00);
              u64From(dest,params->q,count_00);
              bVar1 = wwIsZero(dest_00,sVar4);
              eVar2 = 0x1f8;
              if ((bVar1 == 0) && (iVar3 = wwCmp(dest_00,dest,sVar4), iVar3 < 0)) {
                bVar1 = ecMulA(dest,ec->base,ec,dest_00,sVar4,dest + sVar4 * 2);
                if (bVar1 == 0) {
                  eVar2 = 0x1f6;
                }
                else {
                  u64To(dest,count,dest);
                  bVar1 = memEq(dest,pubkey,count);
                  eVar2 = 0x1f9;
                  if (bVar1 != 0) {
                    eVar2 = 0;
                  }
                }
              }
            }
          }
        }
        blobClose(ec);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bignKeypairVal(const bign_params* params, const octet privkey[],
	const octet pubkey[])
{
	err_t code;
	size_t no, n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* Q;				/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignKeypairVal_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no = ec->f->no;
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(privkey, no) || !memIsValid(pubkey, 2 * no))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + n;
	stack = Q + 2 * n;
	// d <- privkey
	wwFrom(d, privkey, no);
	// 0 < d < q?
	wwFrom(Q, params->q, no);
	if (wwIsZero(d, n) || wwCmp(d, Q, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// Q <- d G
	if (ecMulA(Q, ec->base, ec, d, n, stack))
	{
		// Q == pubkey?
		wwTo(Q, 2 * no, Q);
		if (!memEq(Q, pubkey, 2 * no))
			code = ERR_BAD_PUBKEY;
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}